

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

int j2k_calculate_tp(opj_cp_t *cp,int img_numcomp,opj_image_t *image,opj_j2k_t *j2k)

{
  opj_tcp_t *poVar1;
  opj_tile_info_t *poVar2;
  int iVar3;
  int *piVar4;
  opj_pi_iterator_t *pi;
  opj_tp_info_t *poVar5;
  int iVar6;
  int iVar7;
  int tileno;
  long lVar8;
  int iVar9;
  
  iVar6 = cp->tw;
  iVar9 = cp->th;
  piVar4 = (int *)malloc((long)(iVar9 * iVar6) << 2);
  j2k->cur_totnum_tp = piVar4;
  lVar8 = 0;
  iVar7 = 0;
  do {
    if (iVar9 * iVar6 <= lVar8) {
      return iVar7;
    }
    poVar1 = cp->tcps;
    iVar9 = 0;
    for (iVar6 = 0; iVar6 <= poVar1[lVar8].numpocs; iVar6 = iVar6 + 1) {
      tileno = (int)lVar8;
      pi = pi_initialise_encode(image,cp,tileno,FINAL_PASS);
      if (pi == (opj_pi_iterator_t *)0x0) {
        return -1;
      }
      iVar3 = j2k_get_num_tp(cp,iVar6,tileno);
      iVar7 = iVar7 + iVar3;
      iVar9 = iVar9 + iVar3;
      pi_destroy(pi,cp,tileno);
    }
    j2k->cur_totnum_tp[lVar8] = iVar9;
    if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
      poVar2 = j2k->cstr_info->tile;
      poVar2[lVar8].num_tps = iVar9;
      poVar5 = (opj_tp_info_t *)malloc((long)iVar9 * 0x14);
      poVar2[lVar8].tp = poVar5;
    }
    lVar8 = lVar8 + 1;
    iVar6 = cp->tw;
    iVar9 = cp->th;
  } while( true );
}

Assistant:

int j2k_calculate_tp(opj_cp_t *cp,int img_numcomp,opj_image_t *image,opj_j2k_t *j2k ){
	int pino,tileno,totnum_tp=0;

	OPJ_ARG_NOT_USED(img_numcomp);

	j2k->cur_totnum_tp = (int *) opj_malloc(cp->tw * cp->th * sizeof(int));
	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		int cur_totnum_tp = 0;
		opj_tcp_t *tcp = &cp->tcps[tileno];
		for(pino = 0; pino <= tcp->numpocs; pino++) {
			int tp_num=0;
			opj_pi_iterator_t *pi = pi_initialise_encode(image, cp, tileno,FINAL_PASS);
			if(!pi) { return -1;}
			tp_num = j2k_get_num_tp(cp,pino,tileno);
			totnum_tp = totnum_tp + tp_num;
			cur_totnum_tp = cur_totnum_tp + tp_num;
			pi_destroy(pi, cp, tileno);
		}
		j2k->cur_totnum_tp[tileno] = cur_totnum_tp;
		/* INDEX >> */
		if (j2k->cstr_info) {
			j2k->cstr_info->tile[tileno].num_tps = cur_totnum_tp;
			j2k->cstr_info->tile[tileno].tp = (opj_tp_info_t *) opj_malloc(cur_totnum_tp * sizeof(opj_tp_info_t));
		}
		/* << INDEX */
	}
	return totnum_tp;
}